

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::emit_isfinite_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  Id IVar2;
  Value *pVVar3;
  Operation *pOVar4;
  Operation *op;
  initializer_list<unsigned_int> local_48;
  Operation *local_38;
  Operation *non_finite_op;
  Operation *inf_op;
  Operation *nan_op;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  nan_op = (Operation *)Converter::Impl::builder(impl);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeBoolType((Builder *)nan_op);
  inf_op = Converter::Impl::allocate((Impl *)pCVar1,OpIsNan,IVar2);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeBoolType((Builder *)nan_op);
  non_finite_op = Converter::Impl::allocate((Impl *)pCVar1,OpIsInf,IVar2);
  pCVar1 = instruction_local;
  pOVar4 = inf_op;
  pVVar3 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  IVar2 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar3,0);
  Operation::add_id(pOVar4,IVar2);
  pCVar1 = instruction_local;
  pOVar4 = non_finite_op;
  pVVar3 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  IVar2 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar3,0);
  Operation::add_id(pOVar4,IVar2);
  Converter::Impl::add((Impl *)instruction_local,inf_op,false);
  Converter::Impl::add((Impl *)instruction_local,non_finite_op,false);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeBoolType((Builder *)nan_op);
  local_38 = Converter::Impl::allocate((Impl *)pCVar1,OpLogicalOr,IVar2);
  op._0_4_ = inf_op->id;
  op._4_4_ = non_finite_op->id;
  local_48._M_array = (iterator)&op;
  local_48._M_len = 2;
  Operation::add_ids(local_38,&local_48);
  Converter::Impl::add((Impl *)instruction_local,local_38,false);
  pOVar4 = Converter::Impl::allocate((Impl *)instruction_local,OpLogicalNot,(Value *)builder);
  Operation::add_id(pOVar4,local_38->id);
  Converter::Impl::add((Impl *)instruction_local,pOVar4,false);
  return true;
}

Assistant:

bool emit_isfinite_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	// There is an OpIsFinite instruction, but it's only supported in kernel mode, so we have to decompose here.

	Operation *nan_op = impl.allocate(spv::OpIsNan, builder.makeBoolType());
	Operation *inf_op = impl.allocate(spv::OpIsInf, builder.makeBoolType());
	nan_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
	inf_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));

	impl.add(nan_op);
	impl.add(inf_op);

	Operation *non_finite_op = impl.allocate(spv::OpLogicalOr, builder.makeBoolType());
	non_finite_op->add_ids({ nan_op->id, inf_op->id });
	impl.add(non_finite_op);

	Operation *op = impl.allocate(spv::OpLogicalNot, instruction);
	op->add_id(non_finite_op->id);
	impl.add(op);
	return true;
}